

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::QueueRequest(CServerBrowser *this,CServerEntry *pEntry)

{
  CServerEntry *pEntry_local;
  CServerBrowser *this_local;
  
  pEntry->m_pPrevReq = this->m_pLastReqServer;
  if (this->m_pLastReqServer == (CServerEntry *)0x0) {
    this->m_pFirstReqServer = pEntry;
  }
  else {
    this->m_pLastReqServer->m_pNextReq = pEntry;
  }
  this->m_pLastReqServer = pEntry;
  this->m_NumRequests = this->m_NumRequests + 1;
  return;
}

Assistant:

void CServerBrowser::QueueRequest(CServerEntry *pEntry)
{
	// add it to the list of servers that we should request info from
	pEntry->m_pPrevReq = m_pLastReqServer;
	if(m_pLastReqServer)
		m_pLastReqServer->m_pNextReq = pEntry;
	else
		m_pFirstReqServer = pEntry;
	m_pLastReqServer = pEntry;

	m_NumRequests++;
}